

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.cpp
# Opt level: O0

size_t duckdb_zstd::ZSTD_checkCParams(ZSTD_compressionParameters cParams)

{
  int iVar1;
  ZSTD_cParameter unaff_retaddr;
  undefined8 in_stack_fffffffffffffff8;
  size_t sVar2;
  int value;
  
  value = (int)((ulong)in_stack_fffffffffffffff8 >> 0x20);
  iVar1 = ZSTD_cParam_withinBounds(unaff_retaddr,value);
  if (iVar1 == 0) {
    sVar2 = 0xffffffffffffffd6;
  }
  else {
    iVar1 = ZSTD_cParam_withinBounds(unaff_retaddr,value);
    if (iVar1 == 0) {
      sVar2 = 0xffffffffffffffd6;
    }
    else {
      iVar1 = ZSTD_cParam_withinBounds(unaff_retaddr,value);
      if (iVar1 == 0) {
        sVar2 = 0xffffffffffffffd6;
      }
      else {
        iVar1 = ZSTD_cParam_withinBounds(unaff_retaddr,value);
        if (iVar1 == 0) {
          sVar2 = 0xffffffffffffffd6;
        }
        else {
          iVar1 = ZSTD_cParam_withinBounds(unaff_retaddr,value);
          if (iVar1 == 0) {
            sVar2 = 0xffffffffffffffd6;
          }
          else {
            iVar1 = ZSTD_cParam_withinBounds(unaff_retaddr,value);
            if (iVar1 == 0) {
              sVar2 = 0xffffffffffffffd6;
            }
            else {
              iVar1 = ZSTD_cParam_withinBounds(unaff_retaddr,value);
              if (iVar1 == 0) {
                sVar2 = 0xffffffffffffffd6;
              }
              else {
                sVar2 = 0;
              }
            }
          }
        }
      }
    }
  }
  return sVar2;
}

Assistant:

size_t ZSTD_checkCParams(ZSTD_compressionParameters cParams)
{
    BOUNDCHECK(ZSTD_c_windowLog, (int)cParams.windowLog);
    BOUNDCHECK(ZSTD_c_chainLog,  (int)cParams.chainLog);
    BOUNDCHECK(ZSTD_c_hashLog,   (int)cParams.hashLog);
    BOUNDCHECK(ZSTD_c_searchLog, (int)cParams.searchLog);
    BOUNDCHECK(ZSTD_c_minMatch,  (int)cParams.minMatch);
    BOUNDCHECK(ZSTD_c_targetLength,(int)cParams.targetLength);
    BOUNDCHECK(ZSTD_c_strategy,  cParams.strategy);
    return 0;
}